

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

int __thiscall
slang::SmallVectorBase<slang::syntax::RsProdSyntax_*>::copy
          (SmallVectorBase<slang::syntax::RsProdSyntax_*> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  RsProdSyntax **__ofirst;
  uninitialized_copy_result<slang::syntax::RsProdSyntax_*const_*,_slang::syntax::RsProdSyntax_**>
  uVar1;
  pointer dest;
  undefined1 in_stack_ffffffffffffffc8 [16];
  RsProdSyntax **__olast;
  BumpAllocator *in_stack_ffffffffffffffd8;
  SmallVectorBase<slang::syntax::RsProdSyntax_*> *__ifirst;
  int iVar2;
  __uninitialized_copy_fn *in_stack_fffffffffffffff0;
  
  __olast = in_stack_ffffffffffffffc8._8_8_;
  if (this->len == 0) {
    std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::span
              ((span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *)0x349769);
    iVar2 = (int)in_stack_fffffffffffffff0;
  }
  else {
    __ifirst = this;
    __ofirst = (RsProdSyntax **)
               BumpAllocator::allocate
                         (in_stack_ffffffffffffffd8,(size_t)__olast,in_stack_ffffffffffffffc8._0_8_)
    ;
    begin(this);
    end(this);
    uVar1 = std::ranges::__uninitialized_copy_fn::
            operator()<slang::syntax::RsProdSyntax_*const_*,_slang::syntax::RsProdSyntax_*const_*,_slang::syntax::RsProdSyntax_**,_slang::syntax::RsProdSyntax_**>
                      (in_stack_fffffffffffffff0,(RsProdSyntax **)__ifirst,(RsProdSyntax **)dst,
                       __ofirst,__olast);
    iVar2 = (int)in_stack_fffffffffffffff0;
    std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::
    span<slang::syntax::RsProdSyntax_**>
              ((span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *)uVar1.out,uVar1.in,
               (size_type)this);
  }
  return iVar2;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }